

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O2

int __thiscall CommandLineTestRunner::runAllTests(CommandLineTestRunner *this)

{
  TestOutput *pTVar1;
  TestRegistry *pTVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  TestResult tr;
  
  initializeTestRun(this);
  sVar4 = CommandLineArguments::getRepeatCount(this->arguments_);
  bVar3 = CommandLineArguments::isListingTestGroupNames(this->arguments_);
  if (bVar3) {
    TestResult::TestResult(&tr,this->output_);
    (*this->registry_->_vptr_TestRegistry[8])(this->registry_,&tr);
  }
  else {
    bVar3 = CommandLineArguments::isListingTestGroupAndCaseNames(this->arguments_);
    if (!bVar3) {
      bVar3 = CommandLineArguments::isReversing(this->arguments_);
      if (bVar3) {
        (*this->registry_->_vptr_TestRegistry[7])();
      }
      bVar3 = CommandLineArguments::isShuffling(this->arguments_);
      if (bVar3) {
        (*this->output_->_vptr_TestOutput[0xb])
                  (this->output_,"Test order shuffling enabled with seed: ");
        pTVar1 = this->output_;
        sVar5 = CommandLineArguments::getShuffleSeed(this->arguments_);
        (*pTVar1->_vptr_TestOutput[0xd])(pTVar1,sVar5);
        (*this->output_->_vptr_TestOutput[0xb])(this->output_,"\n");
      }
      lVar8 = 0;
      iVar7 = 0;
      for (lVar6 = 1; lVar6 - sVar4 != 1; lVar6 = lVar6 + 1) {
        bVar3 = CommandLineArguments::isShuffling(this->arguments_);
        if (bVar3) {
          pTVar2 = this->registry_;
          sVar5 = CommandLineArguments::getShuffleSeed(this->arguments_);
          (*pTVar2->_vptr_TestRegistry[6])(pTVar2,sVar5);
        }
        (*this->output_->_vptr_TestOutput[0x10])(this->output_,lVar6,sVar4);
        TestResult::TestResult(&tr,this->output_);
        (*this->registry_->_vptr_TestRegistry[5])(this->registry_,&tr);
        lVar8 = lVar8 + tr.failureCount_;
        iVar7 = iVar7 + (uint)(tr.ignoredCount_ + tr.runCount_ == 0 || tr.failureCount_ != 0);
        TestResult::~TestResult(&tr);
      }
      if (lVar8 != 0) {
        return (int)lVar8;
      }
      return iVar7;
    }
    TestResult::TestResult(&tr,this->output_);
    (*this->registry_->_vptr_TestRegistry[9])(this->registry_,&tr);
  }
  TestResult::~TestResult(&tr);
  return 0;
}

Assistant:

int CommandLineTestRunner::runAllTests()
{
    initializeTestRun();
    size_t loopCount = 0;
    size_t failedTestCount = 0;
    size_t failedExecutionCount = 0;
    size_t repeatCount = arguments_->getRepeatCount();

    if (arguments_->isListingTestGroupNames())
    {
        TestResult tr(*output_);
        registry_->listTestGroupNames(tr);
        return 0;
    }

    if (arguments_->isListingTestGroupAndCaseNames())
    {
        TestResult tr(*output_);
        registry_->listTestGroupAndCaseNames(tr);
        return 0;
    }

    if (arguments_->isReversing())
        registry_->reverseTests();

    if (arguments_->isShuffling())
    {
        output_->print("Test order shuffling enabled with seed: ");
        output_->print(arguments_->getShuffleSeed());
        output_->print("\n");
    }
    while (loopCount++ < repeatCount) {

        if (arguments_->isShuffling())
            registry_->shuffleTests(arguments_->getShuffleSeed());

        output_->printTestRun(loopCount, repeatCount);
        TestResult tr(*output_);
        registry_->runAllTests(tr);
        failedTestCount += tr.getFailureCount();
        if (tr.isFailure()) {
            failedExecutionCount++;
        }
    }
    return (int) (failedTestCount != 0 ? failedTestCount : failedExecutionCount);
}